

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

int fy_parse_tag_directive(fy_parser *fyp,fy_token *fyt)

{
  fy_document_state *fyds;
  list_head *plVar1;
  list_head *plVar2;
  _Bool _Var3;
  char *pcVar4;
  char *prefix;
  fy_token *fyt_td;
  int line;
  size_t handle_size;
  size_t prefix_size;
  fy_diag_report_ctx local_58;
  
  fyds = fyp->current_document_state;
  if (fyds == (fy_document_state *)0x0) {
    pcVar4 = "no current document state error";
    line = 0x18c;
  }
  else {
    pcVar4 = fy_tag_directive_token_handle(fyt,&handle_size);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "bad tag directive token (handle)";
      line = 400;
    }
    else {
      prefix = fy_tag_directive_token_prefix(fyt,&prefix_size);
      if (prefix != (char *)0x0) {
        fyt_td = fy_document_state_lookup_tag_directive
                           (fyds,pcVar4,CONCAT44(handle_size._4_4_,(uint)handle_size));
        if (fyt_td == (fy_token *)0x0) {
LAB_0012ade9:
          if (fyt != (fy_token *)0x0) {
            plVar1 = (fyds->fyt_td)._lh.prev;
            (fyds->fyt_td)._lh.prev = &fyt->node;
            (fyt->node).next = &(fyds->fyt_td)._lh;
            (fyt->node).prev = plVar1;
            plVar1->next = &fyt->node;
          }
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x1a8,"fy_parse_tag_directive",
                         "document parsed tag directive with handle=%.*s",(ulong)(uint)handle_size,
                         pcVar4);
          _Var3 = fy_tag_is_default(pcVar4,CONCAT44(handle_size._4_4_,(uint)handle_size),prefix,
                                    prefix_size);
          if (_Var3) {
            return 0;
          }
          fyds->field_0x1c = fyds->field_0x1c | 2;
          return 0;
        }
        _Var3 = fy_token_tag_directive_is_overridable(fyt_td);
        if (_Var3) {
          fy_parser_diag(fyp,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x19f,"fy_parse_tag_directive","overriding tag");
          plVar1 = (fyt_td->node).next;
          plVar2 = (fyt_td->node).prev;
          plVar1->prev = plVar2;
          plVar2->next = plVar1;
          (fyt_td->node).next = &fyt_td->node;
          (fyt_td->node).prev = &fyt_td->node;
          fy_token_unref(fyt_td);
          goto LAB_0012ade9;
        }
        local_58.has_override = false;
        local_58._17_7_ = 0;
        local_58.override_file = (char *)0x0;
        local_58.override_line = 0;
        local_58.override_column = 0;
        local_58.type = FYET_ERROR;
        local_58.module = FYEM_PARSE;
        local_58.fyt = fy_token_ref(fyt);
        fy_parser_diag_report(fyp,&local_58,"duplicate tag directive");
        goto LAB_0012aecf;
      }
      pcVar4 = "bad tag directive token (prefix)";
      line = 0x194;
    }
  }
  fy_parser_diag(fyp,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,line,"fy_parse_tag_directive",pcVar4);
LAB_0012aecf:
  fy_token_unref(fyt);
  return -1;
}

Assistant:

int fy_parse_tag_directive(struct fy_parser *fyp, struct fy_token *fyt) {
    struct fy_document_state *fyds;
    struct fy_token *fyt_td;
    const char *handle, *prefix;
    size_t handle_size, prefix_size;
    bool can_override;

    fyds = fyp->current_document_state;
    fyp_error_check(fyp, fyds, err_out,
                    "no current document state error");

    handle = fy_tag_directive_token_handle(fyt, &handle_size);
    fyp_error_check(fyp, handle, err_out,
                    "bad tag directive token (handle)");

    prefix = fy_tag_directive_token_prefix(fyt, &prefix_size);
    fyp_error_check(fyp, prefix, err_out,
                    "bad tag directive token (prefix)");

    fyt_td = fy_document_state_lookup_tag_directive(fyds, handle, handle_size);

    can_override = fyt_td && fy_token_tag_directive_is_overridable(fyt_td);

    FYP_TOKEN_ERROR_CHECK(fyp, fyt, FYEM_PARSE,
                          !fyt_td || can_override, err_out,
                          "duplicate tag directive");

    if (fyt_td) {
        fyp_notice(fyp, "overriding tag");
        fy_token_list_del(&fyds->fyt_td, fyt_td);
        fy_token_unref(fyt_td);
    }

    fy_token_list_add_tail(&fyds->fyt_td, fyt);
    fyt = NULL;

    fyp_scan_debug(fyp, "document parsed tag directive with handle=%.*s",
                   (int) handle_size, handle);

    if (!fy_tag_is_default(handle, handle_size, prefix, prefix_size))
        fyds->tags_explicit = true;

    return 0;
    err_out:
    fy_token_unref(fyt);
    return -1;
}